

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_rc2_test.c
# Opt level: O1

int main(int argc,char **argv)

{
  MppCodingType MVar1;
  MpiEncTestArgs *pMVar2;
  MppCtx pvVar3;
  bool bVar4;
  MppFrame pvVar5;
  MppApi **ppMVar6;
  MPP_RET MVar7;
  int iVar8;
  RK_S32 RVar9;
  undefined4 uVar10;
  MpiEncTestArgs *cmd;
  MpiRc2TestCtx *ctx;
  size_t sVar11;
  FILE *pFVar12;
  RK_S64 RVar13;
  void *__ptr;
  RK_U8 *pRVar14;
  undefined8 uVar15;
  long lVar16;
  ulong uVar17;
  RK_U32 RVar18;
  int iVar19;
  char *pcVar20;
  MppEncCfg pvVar21;
  uint uVar22;
  MppCtx *ppvVar23;
  char *pcVar24;
  MppApi *pMVar25;
  RK_U32 RVar26;
  MppBufferGroup *ppvVar27;
  double dVar28;
  MppPollType block;
  MppPollType block_1;
  MppFrameFormat format;
  RK_U32 fast_en;
  MppFrame local_a8;
  MppParam local_a0;
  uint local_94;
  MppBufferGroup *local_90;
  MpiEncTestArgs *local_88;
  undefined4 local_7c;
  MppEncCfg local_78;
  MppApi *local_70;
  MppApi **local_68;
  MppCtx *local_60;
  MppApi **local_58;
  MppApi **local_50;
  MppCtx *local_48;
  MppCtx *local_40;
  int local_34;
  
  cmd = mpi_enc_test_cmd_get();
  MVar7 = mpi_enc_test_cmd_update_by_args(cmd,argc,argv);
  if (MVar7 == MPP_OK) {
    mpi_enc_test_cmd_show_opt(cmd);
    ctx = (MpiRc2TestCtx *)mpp_osal_calloc("main",0x2a0);
    if (ctx != (MpiRc2TestCtx *)0x0) {
      ctx->enc_cmd = cmd;
      if (cmd->file_input != (char *)0x0) {
        reader_init(&ctx->reader,cmd->file_input,cmd->type_src);
      }
      pcVar20 = cmd->file_input;
      if (ctx->reader == (FileReader)0x0) {
        bVar4 = false;
        _mpp_log_l(2,"mpi_rc_test","failed to open dec input file %s\n",0,pcVar20);
        MVar7 = MPP_NOK;
      }
      else {
        sVar11 = reader_size(ctx->reader);
        MVar7 = MPP_OK;
        _mpp_log_l(4,"mpi_rc_test","input file %s size %ld\n",0,pcVar20,sVar11);
        ctx->dec_type = cmd->type_src;
        bVar4 = true;
        if (cmd->file_output != (char *)0x0) {
          pFVar12 = fopen(cmd->file_output,"w+b");
          (ctx->file).fp_enc_out = (FILE *)pFVar12;
          if (pFVar12 == (FILE *)0x0) {
            bVar4 = false;
            _mpp_log_l(2,"mpi_rc_test","failed to open enc output file %s\n",0,cmd->file_output);
            MVar7 = MPP_ERR_OPEN_FILE;
          }
        }
      }
      if (!bVar4) {
        _mpp_log_l(2,"mpi_rc_test","mpi_rc_init failded ret %d",0,MVar7);
        goto LAB_00106945;
      }
      ppvVar27 = &ctx->pkt_grp;
      iVar8 = mpp_buffer_group_get(ppvVar27,1,0,"mpi_rc_test","mpi_rc_buffer_init");
      if (iVar8 == 0) {
        pRVar14 = (RK_U8 *)mpp_osal_calloc("mpi_rc_buffer_init",0x40000);
        ctx->dec_in_buf_post = pRVar14;
        if (pRVar14 == (RK_U8 *)0x0) {
          _mpp_log_l(2,"mpi_rc_test","mpi_dec_test malloc input stream buffer failed\n",0);
          goto LAB_00106b41;
        }
        ctx->dec_in_buf_post_size = 0x40000;
        ctx->frm_idx = 0;
        ctx->calc_base_idx = 0;
        ctx->stream_size_1s = 0;
      }
      else {
        _mpp_log_l(2,"mpi_rc_test","failed to get buffer group for output packet ret %d\n",0,iVar8);
LAB_00106b41:
        ctx->dec_ctx_post = (MppCtx)0x0;
        ctx->dec_ctx_pre = (MppCtx)0x0;
        if (ctx->dec_in_buf_post != (RK_U8 *)0x0) {
          mpp_osal_free("mpi_rc_buffer_init");
        }
        ctx->dec_in_buf_post = (RK_U8 *)0x0;
        if (ctx->pkt_grp != (MppBufferGroup)0x0) {
          mpp_buffer_group_put();
          *ppvVar27 = (MppBufferGroup)0x0;
        }
      }
      if (iVar8 < 0) {
LAB_00107630:
        _mpp_log_l(2,"mpi_rc_test","%d failed\n","mpi_rc_codec");
      }
      else {
        pMVar2 = ctx->enc_cmd;
        local_a8 = (MppFrame)((ulong)local_a8 & 0xffffffff00000000);
        local_a0 = (MppParam)((ulong)local_a0 & 0xffffffff00000000);
        local_48 = &ctx->dec_ctx_post;
        local_50 = &ctx->dec_mpi_post;
        MVar7 = mpp_create();
        if (MVar7 == MPP_OK) {
          pvVar3 = ctx->dec_ctx_post;
          pMVar25 = ctx->dec_mpi_post;
          MVar7 = mpp_packet_init(&ctx->dec_pkt_post,ctx->dec_in_buf_post,ctx->dec_in_buf_post_size)
          ;
          if (MVar7 != MPP_OK) {
            pcVar20 = "mpp_packet_init failed\n";
            goto LAB_00106d1d;
          }
          MVar7 = (*pMVar25->control)(pvVar3,MPP_DEC_SET_PARSER_SPLIT_MODE,&local_a0);
          if (MVar7 != MPP_OK) {
            pcVar20 = "dec_mpi->control failed\n";
            goto LAB_00106d1d;
          }
          MVar7 = (*pMVar25->control)(pvVar3,MPP_SET_INPUT_TIMEOUT,&local_a8);
          if (MVar7 != MPP_OK) {
            pcVar20 = "dec_mpi->control dec MPP_SET_INPUT_TIMEOUT failed\n";
            goto LAB_00106d1d;
          }
          local_a8 = (MppFrame)((ulong)local_a8 & 0xffffffff00000000);
          MVar7 = (*pMVar25->control)(pvVar3,MPP_SET_OUTPUT_TIMEOUT,&local_a8);
          if (MVar7 != MPP_OK) {
            pcVar20 = "dec_mpi->control MPP_SET_OUTPUT_TIMEOUT failed\n";
            goto LAB_00106d1d;
          }
          MVar7 = mpp_init(pvVar3,0,pMVar2->type);
          if (MVar7 != MPP_OK) {
            pcVar20 = "mpp_init dec failed\n";
            goto LAB_00106d1d;
          }
        }
        else {
          pcVar20 = "mpp_create decoder failed\n";
LAB_00106d1d:
          _mpp_log_l(2,"mpi_rc_test",pcVar20,0);
          if (MVar7 < MPP_OK) goto LAB_00107630;
        }
        local_a8 = (MppFrame)CONCAT44(local_a8._4_4_,1);
        local_a0 = (MppParam)((ulong)local_a0 & 0xffffffff00000000);
        local_7c = 0;
        local_94 = 0;
        local_34 = 0;
        local_90 = ppvVar27;
        mpp_env_get_u32("fbc_dec_en",&local_34,0);
        mpp_env_get_u32("fast_en",&local_7c,0);
        if (local_34 != 0) {
          local_94 = local_94 | 0x200000;
        }
        local_60 = &ctx->dec_ctx_pre;
        local_68 = &ctx->dec_mpi_pre;
        MVar7 = mpp_create();
        if (MVar7 == MPP_OK) {
          pvVar3 = ctx->dec_ctx_pre;
          pMVar25 = ctx->dec_mpi_pre;
          MVar7 = mpp_packet_init(&ctx->dec_pkt_pre,ctx->dec_in_buf_pre,ctx->dec_in_buf_pre_size);
          if (MVar7 != MPP_OK) {
            pcVar20 = "mpp_packet_init failed\n";
            goto LAB_00106e24;
          }
          MVar7 = (*pMVar25->control)(pvVar3,MPP_DEC_SET_PARSER_SPLIT_MODE,&local_a8);
          pcVar20 = "dec_mpi->control failed\n";
          if ((MVar7 != MPP_OK) ||
             (MVar7 = (*pMVar25->control)(pvVar3,MPP_DEC_SET_PARSER_FAST_MODE,&local_7c),
             MVar7 != MPP_OK)) goto LAB_00106e24;
          MVar7 = (*pMVar25->control)(pvVar3,MPP_SET_INPUT_TIMEOUT,&local_a0);
          if (MVar7 != MPP_OK) {
            pcVar20 = "dec_mpi->control dec MPP_SET_INPUT_TIMEOUT failed\n";
            goto LAB_00106e24;
          }
          local_a0 = (MppParam)((ulong)local_a0 & 0xffffffff00000000);
          MVar7 = (*pMVar25->control)(pvVar3,MPP_SET_OUTPUT_TIMEOUT,&local_a0);
          if (MVar7 != MPP_OK) {
            pcVar20 = "dec_mpi->control MPP_SET_OUTPUT_TIMEOUT failed\n";
            goto LAB_00106e24;
          }
          MVar7 = mpp_init(pvVar3,0,ctx->dec_type);
          if (MVar7 != MPP_OK) {
            pcVar20 = "mpp_init dec failed\n";
            goto LAB_00106e24;
          }
          MVar7 = (*pMVar25->control)(pvVar3,MPP_DEC_SET_OUTPUT_FORMAT,&local_94);
          if (MVar7 != MPP_OK) goto LAB_00106e24;
        }
        else {
          pcVar20 = "mpp_create decoder failed\n";
LAB_00106e24:
          _mpp_log_l(2,"mpi_rc_test",pcVar20,0);
          ppvVar27 = local_90;
          if (MVar7 < MPP_OK) goto LAB_00107630;
        }
        ppvVar27 = local_90;
        iVar8 = mpp_enc_cfg_init(&ctx->cfg);
        if (iVar8 < 0) goto LAB_00107630;
        local_88 = ctx->enc_cmd;
        local_a8 = (MppFrame)((ulong)local_a8 & 0xffffffff00000000);
        local_a0 = (MppParam)CONCAT44(local_a0._4_4_,1);
        pvVar21 = ctx->cfg;
        local_7c = 0;
        local_94 = 0;
        ppvVar23 = &ctx->enc_ctx;
        local_58 = &ctx->enc_mpi;
        MVar7 = mpp_create(ppvVar23);
        if (MVar7 == MPP_OK) {
          pvVar3 = ctx->enc_ctx;
          pMVar25 = ctx->enc_mpi;
          (ctx->rc_cfg).fps_in_denom = 1;
          (ctx->rc_cfg).fps_out_denom = 1;
          (ctx->rc_cfg).fps_in_flex = 0;
          (ctx->rc_cfg).fps_in_num = 0x1e;
          (ctx->rc_cfg).fps_out_flex = 0;
          (ctx->rc_cfg).fps_out_num = 0x1e;
          (ctx->rc_cfg).max_reenc_times = 1;
          (ctx->rc_cfg).gop = local_88->gop_len;
          local_a8 = (MppFrame)CONCAT44(local_a8._4_4_,0xffffffff);
          local_78 = pvVar21;
          MVar7 = (*pMVar25->control)(pvVar3,MPP_SET_INPUT_TIMEOUT,&local_a8);
          if (MVar7 == MPP_OK) {
            local_a8 = (MppFrame)CONCAT44(local_a8._4_4_,0xffffffff);
            MVar7 = (*pMVar25->control)(pvVar3,MPP_SET_OUTPUT_TIMEOUT,&local_a8);
            pMVar2 = local_88;
            if (MVar7 == MPP_OK) {
              local_70 = pMVar25;
              MVar7 = mpp_init(pvVar3,1,local_88->type);
              pvVar21 = local_78;
              if (MVar7 == MPP_OK) {
                if (pMVar2->width != 0) {
                  mpp_enc_cfg_set_s32(local_78,"prep:width");
                }
                pMVar25 = local_70;
                if (pMVar2->height != 0) {
                  mpp_enc_cfg_set_s32(pvVar21,"prep:height");
                }
                if (pMVar2->hor_stride != 0) {
                  mpp_enc_cfg_set_s32(pvVar21,"prep:hor_stride");
                }
                if (pMVar2->ver_stride != 0) {
                  mpp_enc_cfg_set_s32(pvVar21,"prep:ver_stride");
                }
                mpp_enc_cfg_set_s32(pvVar21,"prep:format",0);
                mpp_enc_cfg_set_s32(pvVar21,"rc:mode",pMVar2->rc_mode);
                iVar8 = pMVar2->rc_mode;
                if (iVar8 == 0) {
                  mpp_enc_cfg_set_s32(pvVar21,"rc:bps_target",pMVar2->bps_target);
                  iVar8 = pMVar2->bps_max;
                  if (iVar8 == 0) {
                    iVar19 = pMVar2->bps_target * 0x11;
                    iVar8 = pMVar2->bps_target * 0x11 + 0xf;
                    if (-1 < iVar19) {
                      iVar8 = iVar19;
                    }
                    iVar8 = iVar8 >> 4;
                  }
                  mpp_enc_cfg_set_s32(pvVar21,"rc:bps_max",iVar8);
                  if (pMVar2->bps_min == 0) {
                    iVar8 = pMVar2->bps_target;
                    iVar19 = iVar8 + 0xf;
                    if (-1 < iVar8) {
                      iVar19 = iVar8;
                    }
                    RVar9 = iVar19 >> 4;
                  }
                  else {
LAB_00107932:
                    RVar9 = pMVar2->bps_max;
                  }
LAB_00107993:
                  pvVar21 = local_78;
                  mpp_enc_cfg_set_s32(local_78,"rc:bps_min",RVar9);
                  pMVar25 = local_70;
                }
                else if (iVar8 != 2) {
                  if (iVar8 == 1) {
                    mpp_enc_cfg_set_s32(pvVar21,"rc:bps_target",pMVar2->bps_target);
                    iVar8 = pMVar2->bps_max;
                    if (iVar8 == 0) {
                      iVar8 = (pMVar2->bps_target * 3) / 2;
                    }
                    mpp_enc_cfg_set_s32(pvVar21,"rc:bps_max",iVar8);
                    if (pMVar2->bps_min != 0) goto LAB_00107932;
                    RVar9 = pMVar2->bps_target / 2;
                    goto LAB_00107993;
                  }
                  _mpp_log_l(2,"mpi_rc_test","unsupport encoder rc mode %d\n","mpi_rc_enc_init");
                }
                mpp_enc_cfg_set_s32(pvVar21,"rc:fps_in_flex",(ctx->rc_cfg).fps_in_flex);
                mpp_enc_cfg_set_s32(pvVar21,"rc:fps_in_num",(ctx->rc_cfg).fps_in_num);
                mpp_enc_cfg_set_s32(pvVar21,"rc:fps_in_denom",(ctx->rc_cfg).fps_in_denom);
                mpp_enc_cfg_set_s32(pvVar21,"rc:fps_out_flex",(ctx->rc_cfg).fps_out_flex);
                mpp_enc_cfg_set_s32(pvVar21,"rc:fps_out_num",(ctx->rc_cfg).fps_out_num);
                mpp_enc_cfg_set_s32(pvVar21,"rc:fps_out_denom",(ctx->rc_cfg).fps_out_denom);
                iVar8 = 0x3c;
                if (pMVar2->gop_len != 0) {
                  iVar8 = pMVar2->gop_len;
                }
                mpp_enc_cfg_set_s32(pvVar21,"rc:gop",iVar8);
                mpp_enc_cfg_set_u32(pvVar21,"rc:drop_mode",0);
                mpp_enc_cfg_set_u32(pvVar21,"rc:drop_thd",0x14);
                mpp_enc_cfg_set_u32(pvVar21,"rc:drop_gap",1);
                mpp_env_get_u32("dbrh_en",&local_7c,0);
                mpp_env_get_u32("dbrh_s",&local_94,0x10);
                pvVar21 = local_78;
                mpp_enc_cfg_set_u32(local_78,"rc:debreath_en",local_7c);
                pMVar2 = local_88;
                mpp_enc_cfg_set_u32(pvVar21,"rc:debreath_strength",local_94);
                mpp_enc_cfg_set_s32(pvVar21,"codec:type",pMVar2->type);
                ppvVar27 = local_90;
                MVar1 = pMVar2->type;
                if ((int)MVar1 < 9) {
                  if (MVar1 == MPP_VIDEO_CodingAVC) {
                    mpp_enc_cfg_set_s32(pvVar21,"h264:profile",100);
                    mpp_enc_cfg_set_s32(pvVar21,"h264:level",0x28);
                    mpp_enc_cfg_set_s32(pvVar21,"h264:cabac_en",1);
                    mpp_enc_cfg_set_s32(pvVar21,"h264:cabac_idc",0);
                    mpp_enc_cfg_set_s32(pvVar21,"h264:trans8x8",1);
                    if (pMVar2->rc_mode == 2) {
                      mpp_enc_cfg_set_s32(pvVar21,"h264:qp_init",0x14);
                      mpp_enc_cfg_set_s32(pvVar21,"h264:qp_max",0x10);
                      mpp_enc_cfg_set_s32(pvVar21,"h264:qp_min",0x10);
                      mpp_enc_cfg_set_s32(pvVar21,"h264:qp_max_i",0x14);
                      uVar15 = 0x14;
                    }
                    else {
                      mpp_enc_cfg_set_s32(pvVar21,"h264:qp_init",0x1a);
                      mpp_enc_cfg_set_s32(pvVar21,"h264:qp_max",0x33);
                      mpp_enc_cfg_set_s32(pvVar21,"h264:qp_min",10);
                      mpp_enc_cfg_set_s32(pvVar21,"h264:qp_max_i",0x2e);
                      uVar15 = 0x12;
                    }
                    mpp_enc_cfg_set_s32(pvVar21,"h264:qp_min_i",uVar15);
                    ppvVar27 = local_90;
                  }
                  else {
                    if (MVar1 == MPP_VIDEO_CodingMJPEG) {
                      mpp_enc_cfg_set_s32(pvVar21,"jpeg:q_factor",0x50);
                      mpp_enc_cfg_set_s32(pvVar21,"jpeg:qf_max",99);
                      pcVar20 = "jpeg:qf_min";
                      uVar15 = 1;
                      goto LAB_00107d30;
                    }
LAB_00107be1:
                    _mpp_log_l(2,"mpi_rc_test","unsupport encoder coding type %d\n",
                               "mpi_rc_enc_init");
                  }
                }
                else {
                  if (MVar1 == MPP_VIDEO_CodingVP8) {
                    mpp_enc_cfg_set_s32(pvVar21,"vp8:qp_init",0x28);
                    mpp_enc_cfg_set_s32(pvVar21,"vp8:qp_max",0x7f);
                    mpp_enc_cfg_set_s32(pvVar21,"vp8:qp_min",0);
                    mpp_enc_cfg_set_s32(pvVar21,"vp8:qp_max_i",0x7f);
                    pcVar20 = "vp8:qp_min_i";
                    uVar15 = 0;
                  }
                  else {
                    if (MVar1 != MPP_VIDEO_CodingHEVC) goto LAB_00107be1;
                    mpp_enc_cfg_set_s32(pvVar21,"h265:qp_init",
                                        -(uint)(local_88->rc_mode == 2) | 0x1a);
                    mpp_enc_cfg_set_s32(pvVar21,"h265:qp_max",0x33);
                    mpp_enc_cfg_set_s32(pvVar21,"h265:qp_min",10);
                    mpp_enc_cfg_set_s32(pvVar21,"h265:qp_max_i",0x2e);
                    pcVar20 = "h265:qp_min_i";
                    uVar15 = 0x12;
                  }
LAB_00107d30:
                  mpp_enc_cfg_set_s32(pvVar21,pcVar20,uVar15);
                }
                MVar7 = (*pMVar25->control)(pvVar3,MPP_ENC_SET_CFG,pvVar21);
                if (MVar7 == MPP_OK) {
                  MVar7 = (*pMVar25->control)(pvVar3,MPP_ENC_SET_SEI_CFG,&local_a0);
                  if (MVar7 == MPP_OK) {
                    MVar7 = MPP_OK;
                    goto LAB_00106fb2;
                  }
                  pcVar20 = "mpi control enc set sei cfg failed ret %d\n";
                }
                else {
                  pcVar20 = "mpi control enc set cfg failed ret %d\n";
                }
                _mpp_log_l(2,"mpi_rc_test",pcVar20,0,MVar7);
                goto LAB_00106fb2;
              }
              pcVar20 = "mpp_init enc failed\n";
            }
            else {
              pcVar20 = "enc_mpi->control MPP_SET_OUTPUT_TIMEOUT failed\n";
            }
          }
          else {
            pcVar20 = "enc_mpi->control MPP_SET_INPUT_TIMEOUT failed\n";
          }
          _mpp_log_l(2,"mpi_rc_test",pcVar20,0);
        }
        else {
          _mpp_log_l(2,"mpi_rc_test","mpp_create encoder failed\n",0);
        }
LAB_00106fb2:
        if (MVar7 < MPP_OK) goto LAB_00107630;
        pthread_create(&ctx->dec_thr,(pthread_attr_t *)0x0,rc2_pre_dec_thread,ctx);
        local_88 = (MpiEncTestArgs *)&ctx->enc_pkt;
        local_40 = ppvVar23;
        do {
          pMVar25 = *local_68;
          pvVar3 = *local_60;
          local_a8 = (MppParam)0x0;
          do {
            while( true ) {
              MVar7 = (*pMVar25->decode_get_frame)(pvVar3,&local_a8);
              if (MVar7 != MPP_OK) {
                _mpp_log_l(2,"mpi_rc_test","decode_get_frame failed ret %d\n",0,MVar7);
                goto LAB_00107434;
              }
              if (local_a8 != (MppParam)0x0) break;
              usleep(3000);
            }
            RVar9 = mpp_frame_get_eos();
            ctx->frm_eos = RVar9;
            iVar8 = mpp_frame_get_info_change(local_a8);
            if (iVar8 == 0) {
              iVar8 = ctx->enc_cmd->frame_num;
              if ((0 < iVar8) && (iVar8 < ctx->frm_idx)) {
                ctx->loop_end = 1;
                mpp_frame_set_eos(local_a8,1);
                RVar9 = mpp_frame_get_eos(local_a8);
                ctx->frm_eos = RVar9;
              }
              ppMVar6 = local_58;
              (*(*local_58)->encode_put_frame)(*ppvVar23,local_a8);
              pMVar2 = local_88;
              (*(*ppMVar6)->encode_get_packet)(*ppvVar23,&local_88->file_input);
              if (pMVar2->file_input != (char *)0x0) {
                uVar17 = mpp_packet_get_length();
                RVar26 = (RK_U32)uVar17;
                (ctx->stat).frame_size = RVar26;
                RVar18 = ctx->stream_size_1s + RVar26;
                ctx->stream_size_1s = RVar18;
                ctx->total_bits = ctx->total_bits + uVar17 * 8;
                if (((ctx->frm_idx - ctx->calc_base_idx) + 1) % (uint)(ctx->rc_cfg).fps_in_num == 0)
                {
                  (ctx->stat).ins_bitrate = RVar18;
                  ctx->stream_size_1s = 0;
                }
                __ptr = (void *)mpp_packet_get_pos(ctx->enc_pkt);
                pFVar12 = (FILE *)(ctx->file).fp_enc_out;
                if (pFVar12 != (FILE *)0x0) {
                  fwrite(__ptr,1,uVar17,pFVar12);
                }
                if (ctx->dec_in_buf_post_size < uVar17) {
                  uVar22 = RVar26 + 0xfff & 0xfffff000;
                  pRVar14 = (RK_U8 *)mpp_osal_realloc("mpi_rc_enc",ctx->dec_in_buf_post,uVar22);
                  ctx->dec_in_buf_post = pRVar14;
                  ctx->dec_in_buf_post_size = uVar22;
                  mpp_packet_set_data(ctx->dec_pkt_post,pRVar14);
                  ppvVar23 = local_40;
                  mpp_packet_set_size(ctx->dec_pkt_post,uVar22);
                  mpp_packet_set_pos(ctx->dec_pkt_post,ctx->dec_in_buf_post);
                  mpp_packet_set_length(ctx->dec_pkt_post,0);
                }
                mpp_packet_write(ctx->dec_pkt_post,0,__ptr);
                mpp_packet_set_pos(ctx->dec_pkt_post,ctx->dec_in_buf_post);
                mpp_packet_set_length(ctx->dec_pkt_post,uVar17);
                mpp_packet_set_size(ctx->dec_pkt_post,uVar17);
                iVar8 = mpp_packet_has_meta(ctx->enc_pkt);
                if (iVar8 == 0) {
                  if ((ctx->enc_cmd->ssim_en != 0) || (ctx->enc_cmd->psnr_en != 0)) {
                    mpp_packet_write(ctx->dec_pkt_post,0,__ptr);
                    mpi_rc_dec_post_decode(ctx,local_a8);
                  }
                }
                else {
                  local_a0 = (MppParam)0x0;
                  uVar15 = mpp_packet_get_meta(ctx->enc_pkt);
                  mpp_meta_get_frame(uVar15,0x6966726d,&local_a0);
                  if ((ctx->enc_cmd->ssim_en != 0) || (ctx->enc_cmd->psnr_en != 0)) {
                    mpp_packet_write(ctx->dec_pkt_post,0,__ptr);
                    mpi_rc_dec_post_decode(ctx,local_a0);
                  }
                  if (local_a0 != (MppParam)0x0) {
                    local_a8 = local_a0;
                  }
                }
                RVar18 = mpp_packet_get_eos(ctx->enc_pkt);
                ctx->enc_pkt_eos = RVar18;
                ctx->frm_idx = ctx->frm_idx + 1;
                mpp_packet_deinit(local_88);
              }
            }
            else {
              _mpp_log_l(4,"mpi_rc_test","decode_get_frame get info changed found\n",0);
              (*pMVar25->control)(pvVar3,MPP_DEC_SET_INFO_CHANGE_READY,(MppParam)0x0);
              pvVar5 = local_a8;
              pvVar21 = ctx->cfg;
              uVar10 = mpp_frame_get_width(local_a8);
              mpp_enc_cfg_set_s32(pvVar21,"prep:width",uVar10);
              pvVar21 = ctx->cfg;
              uVar10 = mpp_frame_get_height(pvVar5);
              mpp_enc_cfg_set_s32(pvVar21,"prep:height",uVar10);
              pvVar21 = ctx->cfg;
              uVar10 = mpp_frame_get_hor_stride(pvVar5);
              mpp_enc_cfg_set_s32(pvVar21,"prep:hor_stride",uVar10);
              pvVar21 = ctx->cfg;
              uVar10 = mpp_frame_get_ver_stride(pvVar5);
              mpp_enc_cfg_set_s32(pvVar21,"prep:ver_stride",uVar10);
              pvVar21 = ctx->cfg;
              uVar10 = mpp_frame_get_fmt(pvVar5);
              mpp_enc_cfg_set_s32(pvVar21,"prep:format",uVar10);
              (*ctx->enc_mpi->control)(ctx->enc_ctx,MPP_ENC_SET_CFG,ctx->cfg);
              (*ctx->dec_mpi_post->control)(ctx->dec_ctx_post,MPP_DEC_SET_FRAME_INFO,pvVar5);
              RVar13 = mpp_time();
              ctx->start_enc = RVar13;
            }
            mpp_frame_deinit(&local_a8);
            local_a8 = (MppParam)0x0;
          } while (ctx->enc_pkt_eos == 0);
LAB_00107434:
        } while (ctx->enc_pkt_eos == 0);
        _mpp_log_l(4,"mpi_rc_test","stream finish\n",0);
        lVar16 = mpp_time();
        uVar17 = lVar16 - ctx->start_enc;
        _mpp_log_l(SUB84((double)(((float)ctx->frm_idx * 1e+06) / (float)uVar17),0),4,"mpi_rc_test",
                   "enc_dec %d frame use time %lld ms frm rate %.2f\n",0,ctx->frm_idx,uVar17 / 1000)
        ;
        iVar8 = ctx->frm_idx;
        if ((long)iVar8 != 0) {
          pMVar2 = ctx->enc_cmd;
          pcVar20 = "smart_p";
          pcVar24 = "smart_p";
          if (pMVar2->gop_mode == 0) {
            pcVar24 = "normal_p";
          }
          _mpp_log_l(SUB84(ctx->total_psnrs * (1.0 / (double)iVar8),0),
                     (1.0 / (double)iVar8) * ctx->total_ssims,4,"mpi_rc_test",
                     "%s: %s: average: bps %d | psnr %5.2f | ssim %5.5f",0,pMVar2->file_input,
                     pcVar24,(int)(ctx->total_bits / (ulong)(long)iVar8) * 0x1e);
          pFVar12 = (FILE *)(ctx->file).fp_stat;
          if (pFVar12 != (FILE *)0x0) {
            if (pMVar2->gop_mode == 0) {
              pcVar20 = "normal_p";
            }
            dVar28 = 1.0 / (double)ctx->frm_idx;
            fprintf(pFVar12,"%s: %s: average: bps %dk | psnr %5.2f | ssim %5.5f \n",
                    SUB84(ctx->total_psnrs * dVar28,0),dVar28 * ctx->total_ssims,pMVar2->file_input,
                    pcVar20,(ulong)(uint)((int)(ctx->total_bits / (ulong)(long)ctx->frm_idx) * 0x1e)
                            / 1000);
          }
        }
        MVar7 = (*(*local_58)->reset)(*ppvVar23);
        ppvVar27 = local_90;
        if (((MVar7 < MPP_OK) || (MVar7 = (*(*local_68)->reset)(*local_60), MVar7 < MPP_OK)) ||
           (MVar7 = (*(*local_50)->reset)(*local_48), MVar7 < MPP_OK)) goto LAB_00107630;
      }
      pthread_join(ctx->dec_thr,(void **)0x0);
      if (ctx->enc_ctx != (MppCtx)0x0) {
        mpp_destroy();
        ctx->enc_ctx = (MppCtx)0x0;
      }
      if (*ppvVar27 != (MppBufferGroup)0x0) {
        mpp_buffer_group_put();
        *ppvVar27 = (MppBufferGroup)0x0;
      }
      if (ctx->dec_pkt_post != (MppPacket)0x0) {
        mpp_packet_deinit(&ctx->dec_pkt_post);
        ctx->dec_pkt_post = (MppPacket)0x0;
      }
      if (ctx->dec_pkt_pre != (MppPacket)0x0) {
        mpp_packet_deinit(&ctx->dec_pkt_pre);
        ctx->dec_pkt_pre = (MppPacket)0x0;
      }
      if (ctx->cfg != (MppEncCfg)0x0) {
        mpp_enc_cfg_deinit();
        ctx->cfg = (MppEncCfg)0x0;
      }
      if (ctx->dec_ctx_post != (MppCtx)0x0) {
        mpp_destroy();
        ctx->dec_ctx_post = (MppCtx)0x0;
      }
      if (ctx->dec_ctx_pre != (MppCtx)0x0) {
        mpp_destroy();
        ctx->dec_ctx_pre = (MppCtx)0x0;
      }
      if (ctx->dec_in_buf_post != (RK_U8 *)0x0) {
        mpp_osal_free("mpi_rc_codec");
      }
      ctx->dec_in_buf_post = (RK_U8 *)0x0;
      if (ctx->dec_in_buf_pre != (RK_U8 *)0x0) {
        mpp_osal_free("mpi_rc_codec");
      }
      ctx->dec_in_buf_pre = (RK_U8 *)0x0;
      MVar7 = MPP_OK;
      goto LAB_00106945;
    }
    MVar7 = MPP_ERR_MALLOC;
  }
  ctx = (MpiRc2TestCtx *)0x0;
LAB_00106945:
  if (ctx != (MpiRc2TestCtx *)0x0) {
    pFVar12 = (FILE *)(ctx->file).fp_enc_out;
    if (pFVar12 != (FILE *)0x0) {
      fclose(pFVar12);
      (ctx->file).fp_enc_out = (FILE *)0x0;
    }
    pFVar12 = (FILE *)(ctx->file).fp_stat;
    if (pFVar12 != (FILE *)0x0) {
      fclose(pFVar12);
      (ctx->file).fp_stat = (FILE *)0x0;
    }
    pFVar12 = (FILE *)(ctx->file).fp_input;
    if (pFVar12 != (FILE *)0x0) {
      fclose(pFVar12);
      (ctx->file).fp_input = (FILE *)0x0;
    }
    if (ctx->reader != (FileReader)0x0) {
      reader_deinit(ctx->reader);
      ctx->reader = (FileReader)0x0;
    }
    if (ctx->com_buf != (RK_U8 *)0x0) {
      mpp_osal_free("mpi_rc_deinit");
    }
    ctx->com_buf = (RK_U8 *)0x0;
  }
  mpi_enc_test_cmd_put(cmd);
  return MVar7;
}

Assistant:

int main(int argc, char **argv)
{
    MpiEncTestArgs* enc_cmd = mpi_enc_test_cmd_get();
    MpiRc2TestCtx *ctx = NULL;
    MPP_RET ret = MPP_OK;

    ret = mpi_enc_test_cmd_update_by_args(enc_cmd, argc, argv);
    if (ret)
        goto DONE;

    mpi_enc_test_cmd_show_opt(enc_cmd);

    ctx = mpp_calloc(MpiRc2TestCtx, 1);
    if (NULL == ctx) {
        ret = MPP_ERR_MALLOC;
        goto DONE;
    }

    ctx->enc_cmd = enc_cmd;

    ret = mpi_rc_init(ctx);
    if (ret) {
        mpp_err("mpi_rc_init failded ret %d", ret);
        goto DONE;
    }

    ret = mpi_rc_codec(ctx);
    if (ret)
        mpp_err("mpi_rc_codec failded ret %d", ret);

DONE:
    if (ctx) {
        mpi_rc_deinit(ctx);
        ctx = NULL;
    }

    mpi_enc_test_cmd_put(enc_cmd);

    return (int)ret;
}